

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numbers.cc
# Opt level: O0

bool __thiscall
absl::anon_unknown_0::safe_parse_positive_int<int>
          (anon_unknown_0 *this,string_view text,int base,int *value_p)

{
  int iVar1;
  int iVar2;
  size_type sVar3;
  const_pointer pvVar4;
  const_reference pvVar5;
  undefined4 in_register_0000000c;
  int *piVar6;
  int iVar7;
  bool bVar8;
  int digit;
  uchar c;
  char *end;
  char *start;
  int vmax_over_base;
  int base_inttype;
  int vmax;
  int value;
  int *value_p_local;
  undefined1 auStack_20 [4];
  int base_local;
  string_view text_local;
  
  piVar6 = (int *)CONCAT44(in_register_0000000c,base);
  text_local._M_len = text._M_len;
  iVar7 = (int)text._M_str;
  base_inttype = 0;
  _auStack_20 = this;
  if (iVar7 < 0) {
    __assert_fail("base >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/build_O0/_deps/abseil-cpp-src/absl/strings/numbers.cc"
                  ,0x3dc,
                  "bool absl::(anonymous namespace)::safe_parse_positive_int(absl::string_view, int, IntType * _Nonnull) [IntType = int]"
                 );
  }
  if (0x7fffffff < iVar7) {
    __assert_fail("vmax >= base_inttype",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/build_O0/_deps/abseil-cpp-src/absl/strings/numbers.cc"
                  ,0x3de,
                  "bool absl::(anonymous namespace)::safe_parse_positive_int(absl::string_view, int, IntType * _Nonnull) [IntType = int]"
                 );
  }
  iVar1 = *(int *)((anonymous_namespace)::LookupTables<int>::kVmaxOverBase + (long)iVar7 * 4);
  bVar8 = true;
  if (1 < iVar7) {
    iVar2 = std::numeric_limits<int>::max();
    bVar8 = iVar2 / iVar7 == iVar1;
  }
  if (!bVar8) {
    __assert_fail("base < 2 || std::numeric_limits<IntType>::max() / base_inttype == vmax_over_base"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/build_O0/_deps/abseil-cpp-src/absl/strings/numbers.cc"
                  ,0x3e1,
                  "bool absl::(anonymous namespace)::safe_parse_positive_int(absl::string_view, int, IntType * _Nonnull) [IntType = int]"
                 );
  }
  end = std::basic_string_view<char,_std::char_traits<char>_>::data
                  ((basic_string_view<char,_std::char_traits<char>_> *)auStack_20);
  sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::size
                    ((basic_string_view<char,_std::char_traits<char>_> *)auStack_20);
  pvVar4 = end + sVar3;
  while( true ) {
    if (pvVar4 <= end) {
      *piVar6 = base_inttype;
      return true;
    }
    pvVar5 = std::array<signed_char,_256UL>::operator[]
                       ((array<signed_char,_256UL> *)(anonymous_namespace)::kAsciiToInt,
                        (ulong)(byte)*end);
    iVar2 = (int)*pvVar5;
    if (iVar7 <= iVar2) {
      *piVar6 = base_inttype;
      return false;
    }
    if (iVar1 < base_inttype) {
      *piVar6 = 0x7fffffff;
      return false;
    }
    if (0x7fffffff - iVar2 < iVar7 * base_inttype) break;
    base_inttype = iVar2 + iVar7 * base_inttype;
    end = end + 1;
  }
  *piVar6 = 0x7fffffff;
  return false;
}

Assistant:

inline bool safe_parse_positive_int(absl::string_view text, int base,
                                    IntType* absl_nonnull value_p) {
  IntType value = 0;
  const IntType vmax = std::numeric_limits<IntType>::max();
  assert(vmax > 0);
  assert(base >= 0);
  const IntType base_inttype = static_cast<IntType>(base);
  assert(vmax >= base_inttype);
  const IntType vmax_over_base = LookupTables<IntType>::kVmaxOverBase[base];
  assert(base < 2 ||
         std::numeric_limits<IntType>::max() / base_inttype == vmax_over_base);
  const char* start = text.data();
  const char* end = start + text.size();
  // loop over digits
  for (; start < end; ++start) {
    unsigned char c = static_cast<unsigned char>(start[0]);
    IntType digit = static_cast<IntType>(kAsciiToInt[c]);
    if (digit >= base_inttype) {
      *value_p = value;
      return false;
    }
    if (value > vmax_over_base) {
      *value_p = vmax;
      return false;
    }
    value *= base_inttype;
    if (value > vmax - digit) {
      *value_p = vmax;
      return false;
    }
    value += digit;
  }
  *value_p = value;
  return true;
}